

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TValue * luaV_tonumber(TValue *obj,TValue *n)

{
  int iVar1;
  TValue *i_o;
  lua_Number num;
  TValue *n_local;
  TValue *obj_local;
  
  obj_local = obj;
  if (obj->tt != 3) {
    if ((obj->tt == 4) &&
       (num = (lua_Number)n, n_local = obj,
       iVar1 = luaO_str2d((char *)&(((obj->value).gc)->h).array,(lua_Number *)&i_o), iVar1 != 0)) {
      *(TValue **)num = i_o;
      *(undefined4 *)((long)num + 8) = 3;
      obj_local = (TValue *)num;
    }
    else {
      obj_local = (TValue *)0x0;
    }
  }
  return obj_local;
}

Assistant:

static const TValue*luaV_tonumber(const TValue*obj,TValue*n){
lua_Number num;
if(ttisnumber(obj))return obj;
if(ttisstring(obj)&&luaO_str2d(svalue(obj),&num)){
setnvalue(n,num);
return n;
}
else
return NULL;
}